

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O2

int Abc_CommandGetInv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *pNtk;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  uint fVerbose;
  char *pcVar2;
  
  pNtk = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Wlc_Ntk_t *)0x0) {
      pcVar2 = "Abc_CommandGetInv(): There is no current design.\n";
    }
    else if (pAbc->pAbcWlc == (void *)0x0) {
      pcVar2 = "Abc_CommandGetInv(): There is no saved invariant.\n";
    }
    else {
      if (pAbc->pAbcWlcInv != (Vec_Int_t *)0x0) {
        pNtk_00 = Wlc_NtkGetInv(pNtk,pAbc->pAbcWlcInv,pAbc->pAbcWlcStr,fVerbose);
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
        return 0;
      }
      pcVar2 = "Abc_CommandGetInv(): Invariant is not available.\n";
    }
    iVar1 = 0;
    Abc_Print(1,pcVar2);
  }
  else {
    Abc_Print(-2,"usage: %%getinv [-vh]\n");
    Abc_Print(-2,
              "\t         places invariant found by PDR as the current network in the main-space\n")
    ;
    Abc_Print(-2,"\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n")
    ;
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandGetInv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Wlc_NtkGetInv( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, Vec_Str_t * vSop, int fVerbose );
    Abc_Ntk_t * pMainNtk;
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandGetInv(): There is no current design.\n" );
        return 0;
    }
    if ( Wlc_AbcGetNtk(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandGetInv(): There is no saved invariant.\n" );
        return 0;
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandGetInv(): Invariant is not available.\n" );
        return 0;
    }
    // derive the network
    pMainNtk = Wlc_NtkGetInv( pNtk, Wlc_AbcGetInv(pAbc), Wlc_AbcGetStr(pAbc), fVerbose );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pMainNtk );
    return 0;
    usage:
    Abc_Print( -2, "usage: %%getinv [-vh]\n" );
    Abc_Print( -2, "\t         places invariant found by PDR as the current network in the main-space\n" );
    Abc_Print( -2, "\t         (in the case of \'sat\' or \'undecided\', inifity clauses are used)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}